

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

refs_t * refs_load_fai(refs_t *r_orig,char *fn,int is_err)

{
  char cVar1;
  ref_entry *__ptr;
  int iVar2;
  khint_t kVar3;
  size_t sVar4;
  refs_t *r;
  char *pcVar5;
  BGZF *pBVar6;
  ref_entry *__ptr_00;
  ushort **ppuVar7;
  longlong lVar8;
  long lVar9;
  ref_entry **pprVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  char *local_30e0;
  int n;
  FILE *local_30d0;
  stat sb;
  char fai_fn [4096];
  char line [8192];
  
  sVar4 = strlen(fn);
  r = r_orig;
  if ((r_orig == (refs_t *)0x0) && (r = refs_create(), r == (refs_t *)0x0)) {
    r = (refs_t *)0x0;
    goto LAB_0011d6f0;
  }
  iVar2 = stat(fn,(stat *)&sb);
  if (iVar2 == 0) {
    if ((r->fp == (BGZF *)0x0) || (iVar2 = bgzf_close(r->fp), iVar2 == 0)) {
      r->fp = (BGZF *)0x0;
      pcVar12 = fn;
      pcVar5 = string_dup(r->pool,fn);
      r->fn = pcVar5;
      if (pcVar5 != (char *)0x0) {
        if (4 < sVar4) {
          pcVar12 = ".fai";
          iVar2 = strcmp(fn + (sVar4 - 4),".fai");
          if (iVar2 == 0) {
            pcVar5[sVar4 - 4] = '\0';
            pcVar5 = r->fn;
          }
        }
        pBVar6 = bgzf_open_ref(pcVar5,pcVar12);
        r->fp = pBVar6;
        if (pBVar6 != (BGZF *)0x0) {
          sprintf(fai_fn,"%.*s.fai",0xffb,r->fn);
          iVar2 = stat(fai_fn,(stat *)&sb);
          if ((iVar2 == 0) && (local_30d0 = fopen(fai_fn,"r"), local_30d0 != (FILE *)0x0)) {
            uVar14 = 0;
            uVar13 = 0;
            do {
              pcVar5 = fgets(line,0x2000,local_30d0);
              if (pcVar5 == (char *)0x0) {
                return r;
              }
              __ptr_00 = (ref_entry *)malloc(0x38);
              if (__ptr_00 == (ref_entry *)0x0) {
                return (refs_t *)0x0;
              }
              pcVar5 = line;
              do {
                pcVar5 = pcVar5 + 1;
                cVar1 = pcVar5[-1];
                if ((long)cVar1 == 0) break;
                ppuVar7 = __ctype_b_loc();
              } while ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) == 0);
              pcVar5[-1] = '\0';
              local_30e0 = pcVar5;
              pcVar12 = string_dup(r->pool,line);
              __ptr_00->name = pcVar12;
              while ((cVar1 = *pcVar5, (long)cVar1 != 0 &&
                     (ppuVar7 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
                pcVar5 = pcVar5 + 1;
              }
              local_30e0 = pcVar5;
              lVar8 = strtoll(pcVar5,&local_30e0,10);
              __ptr_00->length = lVar8;
              pcVar5 = local_30e0;
              while ((cVar1 = *pcVar5, (long)cVar1 != 0 &&
                     (ppuVar7 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
                pcVar5 = pcVar5 + 1;
              }
              local_30e0 = pcVar5;
              lVar8 = strtoll(pcVar5,&local_30e0,10);
              __ptr_00->offset = lVar8;
              pcVar5 = local_30e0;
              while ((cVar1 = *pcVar5, (long)cVar1 != 0 &&
                     (ppuVar7 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
                pcVar5 = pcVar5 + 1;
              }
              local_30e0 = pcVar5;
              lVar9 = strtol(pcVar5,&local_30e0,10);
              __ptr_00->bases_per_line = (int)lVar9;
              pcVar5 = local_30e0;
              while ((cVar1 = *pcVar5, (long)cVar1 != 0 &&
                     (ppuVar7 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
                pcVar5 = pcVar5 + 1;
              }
              local_30e0 = pcVar5;
              lVar9 = strtol(pcVar5,&local_30e0,10);
              __ptr_00->line_length = (int)lVar9;
              __ptr_00->fn = r->fn;
              __ptr_00->count = 0;
              __ptr_00->seq = (char *)0x0;
              kVar3 = kh_put_refs(r->h_meta,__ptr_00->name,&n);
              if (n == 0) {
                pprVar10 = r->h_meta->vals;
                __ptr = pprVar10[kVar3];
                if (__ptr == (ref_entry *)0x0) goto LAB_0011d906;
                if ((__ptr->count == 0) && (__ptr->length == 0)) {
                  free(__ptr);
                  goto LAB_0011d8d3;
                }
                free(__ptr_00);
              }
              else {
                if (n == -1) {
                  free(__ptr_00);
                  return (refs_t *)0x0;
                }
LAB_0011d8d3:
                pprVar10 = r->h_meta->vals;
LAB_0011d906:
                pprVar10[kVar3] = __ptr_00;
              }
              pprVar10 = r->ref_id;
              if ((long)(int)uVar13 <= (long)uVar14) {
                bVar16 = uVar13 == 0;
                uVar13 = uVar13 * 2;
                if (bVar16) {
                  uVar13 = 0x10;
                }
                pprVar10 = (ref_entry **)realloc(pprVar10,(long)(int)uVar13 * 8);
                r->ref_id = pprVar10;
                uVar15 = (ulong)uVar13;
                uVar11 = uVar14;
                if ((int)uVar13 <= (int)uVar14) {
                  uVar15 = uVar14 & 0xffffffff;
                }
                for (; pprVar10 = r->ref_id, uVar15 != uVar11; uVar11 = uVar11 + 1) {
                  pprVar10[uVar11] = (ref_entry *)0x0;
                }
              }
              pprVar10[uVar14] = __ptr_00;
              uVar14 = uVar14 + 1;
              r->nref = (int)uVar14;
            } while( true );
          }
          if (is_err != 0) {
            fn = fai_fn;
            goto LAB_0011d712;
          }
        }
      }
    }
  }
  else if (is_err != 0) {
LAB_0011d712:
    perror(fn);
  }
  if (r_orig != (refs_t *)0x0) {
    return (refs_t *)0x0;
  }
LAB_0011d6f0:
  refs_free(r);
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_load_fai(refs_t *r_orig, char *fn, int is_err) {
    struct stat sb;
    FILE *fp = NULL;
    char fai_fn[PATH_MAX];
    char line[8192];
    refs_t *r = r_orig;
    size_t fn_l = strlen(fn);
    int id = 0, id_alloc = 0;

    RP("refs_load_fai %s\n", fn);

    if (!r)
	if (!(r = refs_create()))
	    goto err;

    /* Open reference, for later use */
    if (stat(fn, &sb) != 0) {
	if (is_err)
	    perror(fn);
	goto err;
    }

    if (r->fp)
	if (bgzf_close(r->fp) != 0)
	    goto err;
    r->fp = NULL;

    if (!(r->fn = string_dup(r->pool, fn)))
	goto err;
	
    if (fn_l > 4 && strcmp(&fn[fn_l-4], ".fai") == 0)
	r->fn[fn_l-4] = 0;

    if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	goto err;

    /* Parse .fai file and load meta-data */
    sprintf(fai_fn, "%.*s.fai", PATH_MAX-5, r->fn);

    if (stat(fai_fn, &sb) != 0) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    if (!(fp = fopen(fai_fn, "r"))) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    while (fgets(line, 8192, fp) != NULL) {
	ref_entry *e = malloc(sizeof(*e));
	char *cp;
	int n;
	khint_t k;

	if (!e)
	    return NULL;

	// id
	for (cp = line; *cp && !isspace(*cp); cp++)
	    ;
	*cp++ = 0;
	e->name = string_dup(r->pool, line);
	
	// length
	while (*cp && isspace(*cp))
	    cp++;
	e->length = strtoll(cp, &cp, 10);

	// offset
	while (*cp && isspace(*cp))
	    cp++;
	e->offset = strtoll(cp, &cp, 10);

	// bases per line
	while (*cp && isspace(*cp))
	    cp++;
	e->bases_per_line = strtol(cp, &cp, 10);

	// line length
	while (*cp && isspace(*cp))
	    cp++;
	e->line_length = strtol(cp, &cp, 10);

	// filename
	e->fn = r->fn;

	e->count = 0;
	e->seq = NULL;

	k = kh_put(refs, r->h_meta, e->name, &n);
	if (-1 == n)  {
	    free(e);
	    return NULL;
	}

	if (n) {
	    kh_val(r->h_meta, k) = e;
	} else {
	    ref_entry *re = kh_val(r->h_meta, k);
	    if (re && (re->count != 0 || re->length != 0)) {
		/* Keep old */
		free(e);
	    } else {
		/* Replace old */
		if (re)
		    free(re);
		kh_val(r->h_meta, k) = e;
	    }
	}

	if (id >= id_alloc) {
	    int x;

	    id_alloc = id_alloc ?id_alloc*2 : 16;
	    r->ref_id = realloc(r->ref_id, id_alloc * sizeof(*r->ref_id));

	    for (x = id; x < id_alloc; x++)
		r->ref_id[x] = NULL;
	}
	r->ref_id[id] = e;
	r->nref = ++id;
    }

    return r;

 err:
    if (fp)
	fclose(fp);

    if (!r_orig)
	refs_free(r);
    
    return NULL;
}